

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_module * ly_ctx_get_disabled_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  ushort uVar1;
  lys_module **pplVar2;
  lys_module *plVar3;
  uint uVar4;
  
  if (idx == (uint32_t *)0x0 || ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).",
           "ly_ctx_get_disabled_module_iter");
  }
  else {
    uVar4 = *idx;
    if (uVar4 < (uint)(ctx->models).used) {
      pplVar2 = (ctx->models).list;
      do {
        plVar3 = pplVar2[uVar4];
        uVar1 = *(ushort *)&plVar3->field_0x40;
        uVar4 = uVar4 + 1;
        *idx = uVar4;
        if ((uVar1 & 0x40) != 0) {
          return plVar3;
        }
      } while (uVar4 < (uint)(ctx->models).used);
    }
  }
  return (lys_module *)0x0;
}

Assistant:

lys_module *
ly_ctx_get_disabled_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        LOGARG;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}